

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O3

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>::
ContIntStateScatterReactions
          (ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
           *this,uint off_L,ChVectorDynamic<> *L)

{
  double dVar1;
  undefined8 uVar2;
  ulong uVar3;
  double *pdVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  
  uVar3 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar6 = (ulong)off_L;
  if ((long)uVar6 < (long)uVar3) {
    pdVar4 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar7 = (ulong)(off_L + 1);
    (this->react_force).m_data[0] = pdVar4[uVar6];
    if (uVar7 < uVar3) {
      (this->react_force).m_data[1] = pdVar4[uVar7];
      if (off_L + 2 < uVar3) {
        dVar1 = pdVar4[off_L + 2];
        (this->react_force).m_data[2] = dVar1;
        pfVar5 = this->reactions_cache;
        if (pfVar5 != (float *)0x0) {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = pdVar4[uVar6];
          auVar8 = vmovhps_avx(auVar8,pdVar4[uVar7]);
          auVar8 = vcvtpd2ps_avx(auVar8);
          uVar2 = vmovlps_avx(auVar8);
          *(undefined8 *)pfVar5 = uVar2;
          pfVar5[2] = (float)dVar1;
        }
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

virtual void ContIntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) override {
        react_force.x() = L(off_L);
        react_force.y() = L(off_L + 1);
        react_force.z() = L(off_L + 2);

        if (reactions_cache) {
            reactions_cache[0] = (float)L(off_L);      // react_force.x();
            reactions_cache[1] = (float)L(off_L + 1);  // react_force.y();
            reactions_cache[2] = (float)L(off_L + 2);  // react_force.z();
        }
    }